

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseMessageChainList
          (sysbvm_context_t *context,sysbvm_parser_state_t *state,size_t startPosition,
          sysbvm_tuple_t receiver,sysbvm_tuple_t firstChainedMessage)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t selector_00;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t arguments;
  sysbvm_tuple_t selector;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  size_t local_40;
  sysbvm_tuple_t local_38;
  
  local_40 = startPosition;
  local_38 = receiver;
  sVar4 = sysbvm_orderedCollection_create(context);
LAB_001259e2:
  sysbvm_orderedCollection_add(context,sVar4,firstChainedMessage);
  do {
    iVar2 = sysbvm_parser_lookKindAt(state,0);
    if (iVar2 != 0x16) {
      sVar5 = sysbvm_parser_makeSourcePositionForTokenRange
                        (context,state->sourceCode,state->tokenSequence,local_40,
                         state->tokenPosition);
      sVar4 = sysbvm_orderedCollection_asArray(context,sVar4);
      sVar4 = sysbvm_astMessageChainNode_create(context,sVar5,local_38,sVar4);
      return sVar4;
    }
    state->tokenPosition = state->tokenPosition + 1;
    uVar3 = sysbvm_parser_lookKindAt(state,0);
    if (uVar3 < 0x15) {
      if ((0x138040U >> (uVar3 & 0x1f) & 1) != 0) {
        sVar1 = state->tokenPosition;
        selector_00 = sysbvm_parser_parseLiteralTokenValue(context,state);
        sVar6 = sysbvm_parser_parseBinaryExpression(context,state);
        sourcePosition =
             sysbvm_parser_makeSourcePositionForTokenRange
                       (context,state->sourceCode,state->tokenSequence,sVar1,state->tokenPosition);
        sVar5 = sysbvm_array_create(context,1);
        if ((sVar5 & 0xf) == 0 && sVar5 != 0) {
          *(sysbvm_tuple_t *)(sVar5 + 0x10) = sVar6;
        }
        goto LAB_00125ac0;
      }
      if (uVar3 == 2) {
        sVar1 = state->tokenPosition;
        selector_00 = sysbvm_parser_parseLiteralTokenValue(context,state);
        sVar5 = sysbvm_array_create(context,0);
        sourcePosition =
             sysbvm_parser_makeSourcePositionForTokenRange
                       (context,state->sourceCode,state->tokenSequence,sVar1,state->tokenPosition);
        goto LAB_00125ac0;
      }
      if (uVar3 == 4) break;
    }
    sVar5 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    sVar5 = sysbvm_astErrorNode_createWithCString(context,sVar5,"Expected a chained message.");
    sysbvm_orderedCollection_add(context,sVar4,sVar5);
    state->tokenPosition = state->tokenPosition + 1;
  } while( true );
  sVar1 = state->tokenPosition;
  local_48 = 0;
  local_50 = 0;
  sysbvm_parser_parseKeywordMessageParts(context,state,&local_48,&local_50);
  sourcePosition =
       sysbvm_parser_makeSourcePositionForTokenRange
                 (context,state->sourceCode,state->tokenSequence,sVar1,state->tokenPosition);
  sVar5 = local_50;
  selector_00 = local_48;
LAB_00125ac0:
  firstChainedMessage =
       sysbvm_astMessageChainMessageNode_create(context,sourcePosition,selector_00,sVar5);
  goto LAB_001259e2;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseMessageChainList(sysbvm_context_t *context, sysbvm_parser_state_t *state, size_t startPosition, sysbvm_tuple_t receiver, sysbvm_tuple_t firstChainedMessage)
{
    sysbvm_tuple_t chainedMessageList = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context, chainedMessageList, firstChainedMessage);

    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_SEMICOLON)
    {
        ++state->tokenPosition;
        switch(sysbvm_parser_lookKindAt(state, 0))
        {
        case SYSBVM_TOKEN_KIND_KEYWORD:
            {
                size_t chainedStartPosition = state->tokenPosition;
                sysbvm_tuple_t selector = SYSBVM_NULL_TUPLE;
                sysbvm_tuple_t arguments = SYSBVM_NULL_TUPLE;

                sysbvm_parser_parseKeywordMessageParts(context, state, &selector, &arguments);
                sysbvm_tuple_t chainedSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, chainedStartPosition, state->tokenPosition);
                sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astMessageChainMessageNode_create(context, chainedSourcePosition, selector, arguments));
            }
            break;
        
        case SYSBVM_TOKEN_KIND_OPERATOR:
        case SYSBVM_TOKEN_KIND_BAR:
        case SYSBVM_TOKEN_KIND_STAR:
        case SYSBVM_TOKEN_KIND_LESS_THAN:
        case SYSBVM_TOKEN_KIND_GREATER_THAN:
            {
                size_t chainedStartPosition = state->tokenPosition;
                sysbvm_tuple_t selector = sysbvm_parser_parseLiteralTokenValue(context, state);
                sysbvm_tuple_t argument = sysbvm_parser_parseBinaryExpression(context, state);
                sysbvm_tuple_t chainedSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, chainedStartPosition, state->tokenPosition);

                sysbvm_tuple_t arguments = sysbvm_array_create(context, 1);
                sysbvm_array_atPut(arguments, 0, argument);
                sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astMessageChainMessageNode_create(context, chainedSourcePosition, selector, arguments));
            }
            break;
        case SYSBVM_TOKEN_KIND_IDENTIFIER:
            {
                size_t chainedStartPosition = state->tokenPosition;
                sysbvm_tuple_t selector = sysbvm_parser_parseLiteralTokenValue(context, state);
                sysbvm_tuple_t arguments = sysbvm_array_create(context, 0);
                sysbvm_tuple_t chainedSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, chainedStartPosition, state->tokenPosition);
                sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astMessageChainMessageNode_create(context, chainedSourcePosition, selector, arguments));
            }
            break;
        default:
            sysbvm_orderedCollection_add(context, chainedMessageList, sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a chained message."));
            ++state->tokenPosition;
            break;
        }
    }

    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);
    return sysbvm_astMessageChainNode_create(context, sourcePosition, receiver, sysbvm_orderedCollection_asArray(context, chainedMessageList));
}